

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<capnp::DynamicValue::Reader&>(String *__return_storage_ptr__,kj *this,Reader *params)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree SStack_48;
  
  capnp::operator*(&SStack_48);
  _::concat<kj::StringTree>(__return_storage_ptr__,&SStack_48);
  sVar2 = SStack_48.branches.size_;
  pBVar3 = SStack_48.branches.ptr;
  if (SStack_48.branches.ptr != (Branch *)0x0) {
    SStack_48.branches.ptr = (Branch *)0x0;
    SStack_48.branches.size_ = 0;
    (**(SStack_48.branches.disposer)->_vptr_ArrayDisposer)
              (SStack_48.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = SStack_48.text.content.size_;
  pcVar1 = SStack_48.text.content.ptr;
  if (SStack_48.text.content.ptr != (char *)0x0) {
    SStack_48.text.content.ptr = (char *)0x0;
    SStack_48.text.content.size_ = 0;
    (**(SStack_48.text.content.disposer)->_vptr_ArrayDisposer)
              (SStack_48.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}